

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(ze_device_image_properties_t val)

{
  ostream *poVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  string *in_RDI;
  stringstream ss;
  ze_structure_type_t in_stack_00000008;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  uint in_stack_00000020;
  ulong in_stack_00000028;
  uint in_stack_00000030;
  uint in_stack_00000034;
  uint in_stack_00000038;
  uint in_stack_0000003c;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  uint auStack_1b0 [22];
  ios_base local_158 [264];
  long *local_50;
  long local_40 [2];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1d8,in_stack_00000008);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  poVar1 = (ostream *)(local_1d8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0x",2);
  *(uint *)((long)auStack_1b0 + *(long *)(local_1c8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_1b0 + *(long *)(local_1c8._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000018) {
    uVar6 = in_stack_00000018;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010404b;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010404b;
      }
      if (uVar6 < 10000) goto LAB_0010404b;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010404b:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000018);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000001c) {
    uVar6 = in_stack_0000001c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00104100;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00104100;
      }
      if (uVar6 < 10000) goto LAB_00104100;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00104100:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000001c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000020) {
    uVar6 = in_stack_00000020;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001041b5;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001041b5;
      }
      if (uVar6 < 10000) goto LAB_001041b5;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001041b5:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000020);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000028) {
    uVar5 = in_stack_00000028;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00104276;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00104276;
      }
      if (uVar5 < 10000) goto LAB_00104276;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00104276:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000028);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000030) {
    uVar6 = in_stack_00000030;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010432c;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010432c;
      }
      if (uVar6 < 10000) goto LAB_0010432c;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010432c:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000030);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000034) {
    uVar6 = in_stack_00000034;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001043e1;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001043e1;
      }
      if (uVar6 < 10000) goto LAB_001043e1;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001043e1:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000034);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000038) {
    uVar6 = in_stack_00000038;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00104496;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00104496;
      }
      if (uVar6 < 10000) goto LAB_00104496;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00104496:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000038);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000003c) {
    uVar6 = in_stack_0000003c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010454b;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010454b;
      }
      if (uVar6 < 10000) goto LAB_0010454b;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010454b:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000003c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string( ze_device_image_properties_t val )
{
    std::string str;
    
    str += "ze_device_image_properties_t.stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "ze_device_image_properties_t.pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims1D : ";
    str += std::to_string(val.maxImageDims1D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims2D : ";
    str += std::to_string(val.maxImageDims2D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageDims3D : ";
    str += std::to_string(val.maxImageDims3D);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageBufferSize : ";
    str += std::to_string(val.maxImageBufferSize);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxImageArraySlices : ";
    str += std::to_string(val.maxImageArraySlices);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxSamplers : ";
    str += std::to_string(val.maxSamplers);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxReadImageArgs : ";
    str += std::to_string(val.maxReadImageArgs);
    str += "\n";
    
    str += "ze_device_image_properties_t.maxWriteImageArgs : ";
    str += std::to_string(val.maxWriteImageArgs);
    str += "\n";

    return str;
}